

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

Am_Value rest_of_height_above_procedure(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Constraint_Context *pAVar3;
  undefined4 extraout_var;
  Am_Value *pAVar4;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar5;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object object;
  Part_Key_Offset_Store_Data *store;
  Am_Object *self_local;
  Am_Value *value;
  Am_Wrapper *this;
  
  Am_Value::Am_Value((Am_Value *)self);
  pAVar3 = Am_Object_Advanced::Get_Context();
  iVar1 = (*pAVar3->_vptr_Am_Constraint_Context[6])();
  this = (Am_Wrapper *)CONCAT44(extraout_var,iVar1);
  Am_Object::Get_Owner(&local_48,(Am_Slot_Flags)in_RSI);
  Am_Object::Get_Object(&local_40,(Am_Slot_Key)&local_48,(ulong)*(ushort *)&this->field_0xc);
  Am_Object::~Am_Object(&local_48);
  pAVar4 = Am_Object::Get(&local_40,0x65,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = Am_Object::Get(in_RSI,0x65,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Value::operator=((Am_Value *)self,
                      (iVar1 - iVar2) -
                      *(int *)&this[1].super_Am_Registered_Type._vptr_Am_Registered_Type);
  Am_Wrapper::Release(this);
  Am_Object::~Am_Object(&local_40);
  AVar5.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar5._0_8_ = self;
  return AVar5;
}

Assistant:

static Am_Value
rest_of_height_above_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Offset_Store_Data *store =
      (Part_Key_Offset_Store_Data *)Am_Object_Advanced::Get_Context()
          ->Get_Data();
  Am_Object object = self.Get_Owner().Get_Object(store->part);
  value = (int)object.Get(Am_TOP) - (int)self.Get(Am_TOP) - store->offset;
  store->Release();
  return value;
}